

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O0

PolymorphicEmitInfo __thiscall
Wasm::WasmBytecodeGenerator::EmitCall<(Wasm::WasmOp)16>(WasmBytecodeGenerator *this)

{
  uint index_00;
  IWasmByteCodeWriter *pIVar1;
  code *pcVar2;
  EmitInfoBase EVar3;
  RegSlot RVar4;
  uint uVar5;
  bool bVar6;
  ArgSlot lhs;
  Local expectedType;
  uint32 uVar7;
  AsmJsRetType AVar8;
  WasmReaderBase *pWVar9;
  undefined4 *puVar10;
  WasmCompilationException *pWVar11;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  EmitInfo EVar12;
  WasmRegisterSpace *pWVar13;
  undefined2 uVar14;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 uVar16;
  undefined1 auVar15 [16];
  PolymorphicEmitInfo PVar17;
  WasmType local_17c;
  uint32 local_174;
  uint32 maxDepthForLevel;
  EmitInfo local_128;
  EmitInfo singleResultInfo;
  Local local_118;
  EmitInfo local_114;
  EmitInfo info_2;
  uint32 i_5;
  uint32 i_4;
  RegSlot local_fc;
  ushort local_f6;
  RegSlot location;
  AsmJsRetType AStack_f0;
  OpCodeAsmJs convertOp;
  uint32 i_3;
  RegSlot local_e8;
  WasmType singleResType;
  RegSlot varRetReg;
  ArgSlot args;
  EmitInfo EStack_dc;
  uint local_d4;
  uint32 local_d0;
  uint32 i_2;
  uint32 index;
  uint32 offset;
  RegSlot funcReg;
  ArgSlot currentArgSize;
  OpCodeAsmJs argOp;
  EmitInfo info_1;
  uint local_b0;
  ArgSlot i_1;
  uint32 argLoc;
  EmitInfo info;
  int i;
  TrackAllocData local_90;
  EmitInfo *local_68;
  EmitInfo *argsList;
  ArgSlot nArgs;
  ushort local_4e;
  uint16 local_4c;
  anon_class_1_0_00000001 local_49;
  OpCodeAsmJs startCallOp;
  ArgSlot argSize;
  WasmFunctionInfo *pWStack_48;
  anon_class_1_0_00000001 argOverflow;
  WasmFunctionInfo *calleeInfo;
  bool isImportCall;
  EmitInfo indirectIndexInfo;
  ProfileId profileId;
  WasmSignature *calleeSignature;
  uint32 signatureId;
  uint32 funcNum;
  WasmBytecodeGenerator *this_local;
  PolymorphicEmitInfo retInfo;
  
  stack0xffffffffffffffd0 = (WasmSignature *)0x0;
  indirectIndexInfo.super_EmitInfoBase.location._2_2_ = 0xffff;
  EmitInfo::EmitInfo((EmitInfo *)((long)&calleeInfo + 4));
  pWVar9 = GetReader(this);
  calleeInfo._3_1_ = (pWVar9->m_currentNode).field_1.call.funcType == Import;
  if (((!(bool)calleeInfo._3_1_) &&
      (pWVar9 = GetReader(this), (pWVar9->m_currentNode).field_1.call.funcType != Function)) &&
     (pWVar9 = GetReader(this), (pWVar9->m_currentNode).field_1.call.funcType != ImportThunk)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                       ,0x449,
                       "(isImportCall || GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::Function || GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::ImportThunk)"
                       ,
                       "isImportCall || GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::Function || GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::ImportThunk"
                      );
    if (!bVar6) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  pWVar9 = GetReader(this);
  index_00 = (pWVar9->m_currentNode).field_1.brTable.numTargets;
  pWStack_48 = Js::WebAssemblyModule::GetWasmFunctionInfo(this->m_module,index_00);
  register0x00000000 = WasmFunctionInfo::GetSignature(pWStack_48);
  pWVar9 = GetReader(this);
  if (((pWVar9->m_currentNode).field_1.call.funcType == Function) &&
     (bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,WasmInOutPhase), !bVar6)) {
    indirectIndexInfo.super_EmitInfoBase.location._2_2_ = GetNextProfileId(this);
  }
  if ((calleeInfo._3_1_ & 1) == 0) {
    local_4e = 0x1c;
    local_4c = WasmSignature::GetParamsSize(stack0xffffffffffffffd0);
  }
  else {
    lhs = WasmSignature::GetParamCount(stack0xffffffffffffffd0);
    local_4c = UInt16Math::
               Mul<Wasm::WasmBytecodeGenerator::EmitCall<(Wasm::WasmOp)16>()::_lambda()_1_const>
                         (lhs,8,&local_49);
    local_4e = 0x11;
  }
  local_4c = UInt16Math::
             Add<Wasm::WasmBytecodeGenerator::EmitCall<(Wasm::WasmOp)16>()::_lambda()_1_const>
                       (local_4c,8,&local_49);
  bVar6 = Math::IsAligned<unsigned_short>(local_4c,8);
  if (!bVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                       ,0x478,"((0))","Wasm argument size should always be Var aligned");
    if (!bVar6) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
    pWVar11 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException(pWVar11,L"Internal Error");
    __cxa_throw(pWVar11,&WasmCompilationException::typeinfo,
                WasmCompilationException::~WasmCompilationException);
  }
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x1f])(this->m_writer,(ulong)local_4e,(ulong)local_4c)
  ;
  argsList._2_2_ = WasmSignature::GetParamCount(stack0xffffffffffffffd0);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_90,(type_info *)&EmitInfo::typeinfo,0,(ulong)(ushort)argsList._2_2_,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
             ,0x481);
  this_00 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
            TrackAllocInfo(&(this->m_alloc).
                            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                           ,&local_90);
  local_68 = Memory::AllocateArray<Memory::ArenaAllocator,Wasm::EmitInfo,false>
                       ((Memory *)this_00,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                        (ulong)(ushort)argsList._2_2_);
  info.super_EmitInfoBase.location = (RegSlot)(ushort)argsList._2_2_;
  while (info.super_EmitInfoBase.location = info.super_EmitInfoBase.location - 1,
        -1 < (int)info.super_EmitInfoBase.location) {
    expectedType = WasmSignature::GetParam
                             (stack0xffffffffffffffd0,(ArgSlot)info.super_EmitInfoBase.location);
    EVar12 = PopEvalStack(this,expectedType,L"Call argument does not match formal type");
    local_68[(int)info.super_EmitInfoBase.location] = EVar12;
  }
  local_b0 = 1;
  info_1.type._2_2_ = Void >> 0x10;
  do {
    if ((ushort)argsList._2_2_ <= (ushort)info_1.type._2_2_) {
      pWVar13 = GetRegisterSpace(this,Ptr);
      index = WAsmJs::RegisterSpace::AcquireTmpRegister(pWVar13);
      if ((calleeInfo._3_1_ & 1) == 0) {
        local_174 = Js::WebAssemblyModule::GetFuncOffset(this->m_module);
      }
      else {
        local_174 = Js::WebAssemblyModule::GetImportFuncOffset();
      }
      i_2 = local_174;
      local_d0 = UInt32Math::Add(local_174,index_00);
      (*this->m_writer->_vptr_IWasmByteCodeWriter[0x18])
                (this->m_writer,0x4e,(ulong)index,1,(ulong)local_d0);
      PolymorphicEmitInfo::PolymorphicEmitInfo((PolymorphicEmitInfo *)&this_local);
      uVar7 = WasmSignature::GetResultCount(stack0xffffffffffffffd0);
      PolymorphicEmitInfo::Init((PolymorphicEmitInfo *)&this_local,uVar7,&this->m_alloc);
      for (local_d4 = 0; uVar5 = local_d4,
          uVar7 = WasmSignature::GetResultCount(stack0xffffffffffffffd0), uVar5 < uVar7;
          local_d4 = local_d4 + 1) {
        varRetReg = WasmSignature::GetResult(stack0xffffffffffffffd0,local_d4);
        EmitInfo::EmitInfo(&stack0xffffffffffffff24,&varRetReg);
        PolymorphicEmitInfo::SetInfo((PolymorphicEmitInfo *)&this_local,EStack_dc,local_d4);
      }
      if ((calleeInfo._3_1_ & 1) == 0) {
        pWVar13 = GetRegisterSpace(this,Ptr);
        WAsmJs::RegisterSpace::ReleaseTmpRegister(pWVar13,index);
        ReleaseLocation(this,(EmitInfo *)((long)&calleeInfo + 4));
        for (info_2.type = (WasmType)(ushort)argsList._2_2_; info_2.type != Void;
            info_2.type = info_2.type - FirstLocalType) {
          ReleaseLocation(this,local_68 + (info_2.type - FirstLocalType));
        }
        for (info_2.super_EmitInfoBase.location = 0;
            EVar3.location = info_2.super_EmitInfoBase.location,
            uVar7 = WasmSignature::GetResultCount(stack0xffffffffffffffd0), EVar3.location < uVar7;
            info_2.super_EmitInfoBase.location = info_2.super_EmitInfoBase.location + 1) {
          local_118 = WasmSignature::GetResult
                                (stack0xffffffffffffffd0,info_2.super_EmitInfoBase.location);
          EmitInfo::EmitInfo(&local_114,&local_118);
          pWVar13 = GetRegisterSpace(this,local_114.type);
          local_114.super_EmitInfoBase.location = WAsmJs::RegisterSpace::AcquireTmpRegister(pWVar13)
          ;
          singleResultInfo.type = local_114.type;
          singleResultInfo.super_EmitInfoBase.location = local_114.super_EmitInfoBase.location;
          PolymorphicEmitInfo::SetInfo
                    ((PolymorphicEmitInfo *)&this_local,singleResultInfo,
                     info_2.super_EmitInfoBase.location);
        }
        uVar7 = PolymorphicEmitInfo::Count((PolymorphicEmitInfo *)&this_local);
        if (uVar7 == 0) {
          maxDepthForLevel = 0;
          EmitInfo::EmitInfo(&local_128,&maxDepthForLevel);
          uVar16 = extraout_XMM0_Qb_00;
        }
        else {
          local_128 = PolymorphicEmitInfo::GetInfo((PolymorphicEmitInfo *)&this_local,0);
          uVar16 = extraout_XMM0_Qb;
        }
        uVar7 = index;
        EVar12 = local_128;
        auVar15._0_8_ = (double)(local_4c >> 3);
        auVar15._8_8_ = uVar16;
        auVar15 = roundsd(auVar15,auVar15,10);
        uVar14 = (undefined2)(int)auVar15._0_8_;
        pIVar1 = this->m_writer;
        singleResType._2_2_ = uVar14;
        AVar8 = WasmToAsmJs::GetAsmJsReturnType(local_128.type);
        (*pIVar1->_vptr_IWasmByteCodeWriter[0x20])
                  (pIVar1,0x1d,(ulong)EVar12 & 0xffffffff,(ulong)uVar7,(ulong)(ushort)uVar14,
                   (ulong)AVar8.which_,(uint)indirectIndexInfo.super_EmitInfoBase.location._2_2_);
      }
      else {
        singleResType._2_2_ = WasmSignature::GetParamCount(stack0xffffffffffffffd0);
        UInt16Math::
        Inc<Wasm::WasmBytecodeGenerator::EmitCall<(Wasm::WasmOp)16>()::_lambda()_1_const>
                  ((uint16 *)((long)&singleResType + 2),&local_49);
        pWVar13 = GetRegisterSpace(this,Ptr);
        local_e8 = WAsmJs::RegisterSpace::AcquireTmpRegister(pWVar13);
        uVar7 = WasmSignature::GetResultCount(stack0xffffffffffffffd0);
        if (1 < uVar7) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                             ,0x4e8,"(calleeSignature->GetResultCount() <= 1)",
                             "Multiple results from function imports not supported");
          if (!bVar6) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 0;
        }
        uVar7 = WasmSignature::GetResultCount(stack0xffffffffffffffd0);
        if (uVar7 == 0) {
          local_17c = Void;
        }
        else {
          local_17c = WasmSignature::GetResult(stack0xffffffffffffffd0,0);
        }
        uVar7 = index;
        uVar14 = singleResType._2_2_;
        RVar4 = local_e8;
        i_3 = local_17c;
        pIVar1 = this->m_writer;
        AStack_f0 = WasmToAsmJs::GetAsmJsReturnType(local_17c);
        (*pIVar1->_vptr_IWasmByteCodeWriter[0x20])
                  (pIVar1,0x12,(ulong)RVar4,(ulong)uVar7,(ulong)(ushort)uVar14,
                   (ulong)AStack_f0.which_,(uint)indirectIndexInfo.super_EmitInfoBase.location._2_2_
                  );
        pWVar13 = GetRegisterSpace(this,Ptr);
        WAsmJs::RegisterSpace::ReleaseTmpRegister(pWVar13,local_e8);
        pWVar13 = GetRegisterSpace(this,Ptr);
        WAsmJs::RegisterSpace::ReleaseTmpRegister(pWVar13,index);
        ReleaseLocation(this,(EmitInfo *)((long)&calleeInfo + 4));
        for (location = (RegSlot)(ushort)argsList._2_2_; location != 0; location = location - 1) {
          ReleaseLocation(this,local_68 + (location - 1));
        }
        uVar7 = WasmSignature::GetResultCount(stack0xffffffffffffffd0);
        if (uVar7 != 0) {
          local_f6 = 6;
          switch(i_3) {
          case 1:
            local_f6 = 0x18;
            break;
          case 2:
            local_f6 = 0x1b;
            break;
          case 3:
            local_f6 = 0x19;
            break;
          case 4:
            local_f6 = 0x1a;
            break;
          case 5:
            pWVar11 = (WasmCompilationException *)__cxa_allocate_exception(8);
            WasmCompilationException::WasmCompilationException
                      (pWVar11,L"Return type: v128 not supported in import calls");
            __cxa_throw(pWVar11,&WasmCompilationException::typeinfo,
                        WasmCompilationException::~WasmCompilationException);
          default:
            WasmTypes::
            CompileAssertCasesNoFailFast<(Wasm::WasmTypes::WasmType)1,(Wasm::WasmTypes::WasmType)2,(Wasm::WasmTypes::WasmType)3,(Wasm::WasmTypes::WasmType)4,(Wasm::WasmTypes::WasmType)5>
                      ();
            pWVar11 = (WasmCompilationException *)__cxa_allocate_exception(8);
            WasmCompilationException::WasmCompilationException
                      (pWVar11,L"Unknown call return type %u",(ulong)i_3);
            __cxa_throw(pWVar11,&WasmCompilationException::typeinfo,
                        WasmCompilationException::~WasmCompilationException);
          }
          pWVar13 = GetRegisterSpace(this,i_3);
          local_fc = WAsmJs::RegisterSpace::AcquireTmpRegister(pWVar13);
          EmitInfo::EmitInfo((EmitInfo *)&i_5,local_fc,&i_3);
          PolymorphicEmitInfo::SetInfo((PolymorphicEmitInfo *)&this_local,_i_5,0);
          (*this->m_writer->_vptr_IWasmByteCodeWriter[0xf])
                    (this->m_writer,(ulong)local_f6,(ulong)local_fc,(ulong)local_e8);
        }
      }
      Memory::DeleteArray<Memory::ArenaAllocator,Wasm::EmitInfo>
                (&this->m_alloc,(ulong)(ushort)argsList._2_2_,local_68);
      if (this->m_maxArgOutDepth < (ushort)singleResType._2_2_ + 1) {
        this->m_maxArgOutDepth = (ushort)singleResType._2_2_ + 1;
      }
      PVar17._4_4_ = 0;
      PVar17.count = (uint)this_local;
      PVar17.field_1 = (anon_union_8_2_2e7736b0_for_PolymorphicEmitInfo_1)retInfo._0_8_;
      return PVar17;
    }
    _funcReg = local_68[(ushort)info_1.type._2_2_];
    offset._2_2_ = 6;
    switch(_currentArgSize) {
    case FirstLocalType:
      offset._2_2_ = 0x20;
      if ((calleeInfo._3_1_ & 1) != 0) {
        offset._2_2_ = 0x14;
      }
      break;
    case I64:
      offset._2_2_ = 0x21;
      if ((calleeInfo._3_1_ & 1) != 0) {
        offset._2_2_ = 0x15;
      }
      break;
    case F32:
      offset._2_2_ = 0x22;
      if ((calleeInfo._3_1_ & 1) != 0) {
        offset._2_2_ = 0x16;
      }
      break;
    case F64:
      offset._2_2_ = 0x1f;
      if ((calleeInfo._3_1_ & 1) != 0) {
        offset._2_2_ = 0x17;
      }
      break;
    case V128:
      Simd::EnsureSimdIsEnabled();
      offset._2_2_ = 0x145;
      if ((calleeInfo._3_1_ & 1) != 0) {
        offset._2_2_ = 0x144;
      }
      break;
    default:
switchD_0163055c_caseD_6:
      WasmTypes::
      CompileAssertCasesNoFailFast<(Wasm::WasmTypes::WasmType)1,(Wasm::WasmTypes::WasmType)2,(Wasm::WasmTypes::WasmType)3,(Wasm::WasmTypes::WasmType)4,(Wasm::WasmTypes::WasmType)5>
                ();
      pWVar11 = (WasmCompilationException *)__cxa_allocate_exception(8);
      WasmCompilationException::WasmCompilationException
                (pWVar11,L"Unknown argument type %u",(ulong)_funcReg >> 0x20);
      __cxa_throw(pWVar11,&WasmCompilationException::typeinfo,
                  WasmCompilationException::~WasmCompilationException);
    case Any:
      bVar6 = IsUnreachable(this);
      if (!bVar6) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                           ,0x4a6,"(IsUnreachable())","IsUnreachable()");
        if (!bVar6) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 0;
      }
      bVar6 = IsUnreachable(this);
      if (!bVar6) goto switchD_0163055c_caseD_6;
      offset._2_2_ = 0x14;
    }
    (*this->m_writer->_vptr_IWasmByteCodeWriter[0xf])
              (this->m_writer,(ulong)offset._2_2_,(ulong)local_b0,(ulong)_funcReg & 0xffffffff);
    if ((calleeInfo._3_1_ & 1) == 0) {
      offset._0_2_ = WasmSignature::GetParamSize(stack0xffffffffffffffd0,info_1.type._2_2_);
      bVar6 = Math::IsAligned<unsigned_short>((ArgSlot)offset,8);
      if (!bVar6) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                           ,0x4bc,"(Math::IsAligned<Js::ArgSlot>(currentArgSize, sizeof(Js::Var)))",
                           "Math::IsAligned<Js::ArgSlot>(currentArgSize, sizeof(Js::Var))");
        if (!bVar6) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 0;
      }
      local_b0 = local_b0 + ((ArgSlot)offset >> 3);
    }
    else {
      local_b0 = local_b0 + 1;
    }
    info_1.type._2_2_ = info_1.type._2_2_ + 1;
  } while( true );
}

Assistant:

PolymorphicEmitInfo WasmBytecodeGenerator::EmitCall()
{
    uint32 funcNum = Js::Constants::UninitializedValue;
    uint32 signatureId = Js::Constants::UninitializedValue;
    WasmSignature* calleeSignature = nullptr;
    Js::ProfileId profileId = Js::Constants::NoProfileId;
    EmitInfo indirectIndexInfo;
    const bool isImportCall = GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::Import;
    Assert(isImportCall || GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::Function || GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::ImportThunk);
    switch (wasmOp)
    {
    case wbCall:
    {
        funcNum = GetReader()->m_currentNode.call.num;
        WasmFunctionInfo* calleeInfo = m_module->GetWasmFunctionInfo(funcNum);
        calleeSignature = calleeInfo->GetSignature();
        // currently only handle inlining internal function calls
        // in future we can expand to all calls by adding checks in inliner and falling back to call in case ScriptFunction doesn't match
        if (GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::Function && !PHASE_TRACE1(Js::WasmInOutPhase))
        {
            profileId = GetNextProfileId();
        }
        break;
    }
    case wbCallIndirect:
        indirectIndexInfo = PopEvalStack(WasmTypes::I32, _u("Indirect call index must be int type"));
        signatureId = GetReader()->m_currentNode.call.num;
        calleeSignature = m_module->GetSignature(signatureId);
        break;
    default:
        Assume(UNREACHED);
    }

    const auto argOverflow = []
    {
        throw WasmCompilationException(_u("Argument size too big"));
    };

    // emit start call
    Js::ArgSlot argSize;
    Js::OpCodeAsmJs startCallOp;
    if (isImportCall)
    {
        argSize = ArgSlotMath::Mul(calleeSignature->GetParamCount(), sizeof(Js::Var), argOverflow);
        startCallOp = Js::OpCodeAsmJs::StartCall;
    }
    else
    {
        startCallOp = Js::OpCodeAsmJs::I_StartCall;
        argSize = calleeSignature->GetParamsSize();
    }
    // Add return value
    argSize = ArgSlotMath::Add(argSize, sizeof(Js::Var), argOverflow);
    if (!Math::IsAligned<Js::ArgSlot>(argSize, sizeof(Js::Var)))
    {
        AssertMsg(UNREACHED, "Wasm argument size should always be Var aligned");
        throw WasmCompilationException(_u("Internal Error"));
    }

    m_writer->AsmStartCall(startCallOp, argSize);

    Js::ArgSlot nArgs = calleeSignature->GetParamCount();

    // copy args into a list so they could be generated in the right order (FIFO)
    EmitInfo* argsList = AnewArray(&m_alloc, EmitInfo, nArgs);
    for (int i = int(nArgs) - 1; i >= 0; --i)
    {
        EmitInfo info = PopEvalStack(calleeSignature->GetParam((Js::ArgSlot)i), _u("Call argument does not match formal type"));
        // We can release the location of the arguments now, because we won't create new temps between start/call
        argsList[i] = info;
    }

    // Skip the this pointer (aka undefined)
    uint32 argLoc = 1;
    for (Js::ArgSlot i = 0; i < nArgs; ++i)
    {
        EmitInfo info = argsList[i];

        Js::OpCodeAsmJs argOp = Js::OpCodeAsmJs::Nop;
        switch (info.type)
        {
        case WasmTypes::F32:
            argOp = isImportCall ? Js::OpCodeAsmJs::ArgOut_Flt : Js::OpCodeAsmJs::I_ArgOut_Flt;
            break;
        case WasmTypes::F64:
            argOp = isImportCall ? Js::OpCodeAsmJs::ArgOut_Db : Js::OpCodeAsmJs::I_ArgOut_Db;
            break;
        case WasmTypes::I32:
            argOp = isImportCall ? Js::OpCodeAsmJs::ArgOut_Int : Js::OpCodeAsmJs::I_ArgOut_Int;
            break;
        case WasmTypes::I64:
            argOp = isImportCall ? Js::OpCodeAsmJs::ArgOut_Long : Js::OpCodeAsmJs::I_ArgOut_Long;
            break;
#ifdef ENABLE_WASM_SIMD
        case WasmTypes::V128:
            Simd::EnsureSimdIsEnabled();
            argOp = isImportCall ? Js::OpCodeAsmJs::Simd128_ArgOut_F4 : Js::OpCodeAsmJs::Simd128_I_ArgOut_F4;
            break;
#endif
        case WasmTypes::Any:
            // In unreachable mode allow any type as argument since we won't actually emit the call
            Assert(IsUnreachable());
            if (IsUnreachable())
            {
                argOp = Js::OpCodeAsmJs::ArgOut_Int;
                break;
            }
            // Fall through
        default:
            WasmTypes::CompileAssertCasesNoFailFast<WasmTypes::I32, WasmTypes::I64, WasmTypes::F32, WasmTypes::F64, WASM_V128_CHECK_TYPE>();
            throw WasmCompilationException(_u("Unknown argument type %u"), info.type);
        }

        m_writer->AsmReg2(argOp, argLoc, info.location);

        // Calculated next argument Js::Var location
        if (isImportCall)
        {
            ++argLoc;
        }
        else
        {
            const Js::ArgSlot currentArgSize = calleeSignature->GetParamSize(i);
            Assert(Math::IsAligned<Js::ArgSlot>(currentArgSize, sizeof(Js::Var)));
            argLoc += currentArgSize / sizeof(Js::Var);
        }
    }

    Js::RegSlot funcReg = GetRegisterSpace(WasmTypes::Ptr)->AcquireTmpRegister();

    // emit call
    switch (wasmOp)
    {
    case wbCall:
    {
        uint32 offset = isImportCall ? m_module->GetImportFuncOffset() : m_module->GetFuncOffset();
        uint32 index = UInt32Math::Add(offset, funcNum);
        m_writer->AsmSlot(Js::OpCodeAsmJs::LdSlot, funcReg, Js::AsmJsFunctionMemory::ModuleEnvRegister, index);
        break;
    }
    case wbCallIndirect:
    {
        Js::RegSlot slotReg = GetRegisterSpace(WasmTypes::Ptr)->AcquireTmpRegister();
        m_writer->AsmSlot(Js::OpCodeAsmJs::LdSlotArr, slotReg, Js::AsmJsFunctionMemory::ModuleEnvRegister, m_module->GetTableEnvironmentOffset());
        m_writer->AsmSlot(Js::OpCodeAsmJs::LdArr_WasmFunc, funcReg, slotReg, indirectIndexInfo.location);
        GetRegisterSpace(WasmTypes::Ptr)->ReleaseTmpRegister(slotReg);
        m_writer->AsmReg1IntConst1(Js::OpCodeAsmJs::CheckSignature, funcReg, calleeSignature->GetSignatureId());
        break;
    }
    default:
        Assume(UNREACHED);
    }

    // calculate number of RegSlots(Js::Var) the call consumes
    PolymorphicEmitInfo retInfo;
    retInfo.Init(calleeSignature->GetResultCount(), &m_alloc);
    for (uint32 i = 0; i < calleeSignature->GetResultCount(); ++i)
    {
        retInfo.SetInfo(EmitInfo(calleeSignature->GetResult(i)), i);
    }
    Js::ArgSlot args;
    if (isImportCall)
    {
        args = calleeSignature->GetParamCount();
        ArgSlotMath::Inc(args, argOverflow);

        Js::RegSlot varRetReg = GetRegisterSpace(WasmTypes::Ptr)->AcquireTmpRegister();
        AssertOrFailFastMsg(calleeSignature->GetResultCount() <= 1, "Multiple results from function imports not supported");
        WasmTypes::WasmType singleResType = calleeSignature->GetResultCount() > 0 ? calleeSignature->GetResult(0) : WasmTypes::Void;
        m_writer->AsmCall(Js::OpCodeAsmJs::Call, varRetReg, funcReg, args, WasmToAsmJs::GetAsmJsReturnType(singleResType), profileId);

        GetRegisterSpace(WasmTypes::Ptr)->ReleaseTmpRegister(varRetReg);
        GetRegisterSpace(WasmTypes::Ptr)->ReleaseTmpRegister(funcReg);

        ReleaseLocation(&indirectIndexInfo);
        //registers need to be released from higher ordinals to lower
        for (uint32 i = nArgs; i > 0; --i)
        {
            ReleaseLocation(&(argsList[i - 1]));
        }

        // emit result coercion
        if (calleeSignature->GetResultCount() > 0)
        {
            Js::OpCodeAsmJs convertOp = Js::OpCodeAsmJs::Nop;
            switch (singleResType)
            {
            case WasmTypes::F32:
                convertOp = Js::OpCodeAsmJs::Conv_VTF;
                break;
            case WasmTypes::F64:
                convertOp = Js::OpCodeAsmJs::Conv_VTD;
                break;
            case WasmTypes::I32:
                convertOp = Js::OpCodeAsmJs::Conv_VTI;
                break;
            case WasmTypes::I64:
                convertOp = Js::OpCodeAsmJs::Conv_VTL;
                break;
#ifdef ENABLE_WASM_SIMD
            case WasmTypes::V128:
                throw WasmCompilationException(_u("Return type: v128 not supported in import calls"));
#endif
            default:
                WasmTypes::CompileAssertCasesNoFailFast<WasmTypes::I32, WasmTypes::I64, WasmTypes::F32, WasmTypes::F64, WASM_V128_CHECK_TYPE>();
                throw WasmCompilationException(_u("Unknown call return type %u"), singleResType);
            }
            Js::RegSlot location = GetRegisterSpace(singleResType)->AcquireTmpRegister();
            retInfo.SetInfo(EmitInfo(location, singleResType), 0);
            m_writer->AsmReg2(convertOp, location, varRetReg);
        }
    }
    else
    {
        GetRegisterSpace(WasmTypes::Ptr)->ReleaseTmpRegister(funcReg);
        ReleaseLocation(&indirectIndexInfo);
        //registers need to be released from higher ordinals to lower
        for (uint32 i = nArgs; i > 0; --i)
        {
            ReleaseLocation(&(argsList[i - 1]));
        }

        for (uint32 i = 0; i < calleeSignature->GetResultCount(); ++i)
        {
            EmitInfo info(calleeSignature->GetResult(i));
            info.location = GetRegisterSpace(info.type)->AcquireTmpRegister();
            retInfo.SetInfo(info, i);
        }

        EmitInfo singleResultInfo = retInfo.Count() > 0 ? retInfo.GetInfo(0) : EmitInfo(WasmTypes::Void);
        args = (Js::ArgSlot)(::ceil((double)(argSize / sizeof(Js::Var))));
        // todo:: add bytecode to call and set aside multi results
        m_writer->AsmCall(Js::OpCodeAsmJs::I_Call, singleResultInfo.location, funcReg, args, WasmToAsmJs::GetAsmJsReturnType(singleResultInfo.type), profileId);
    }
    AdeleteArray(&m_alloc, nArgs, argsList);

    // WebAssemblyArrayBuffer is not detachable, no need to check for detached state here

    // track stack requirements for out params

    // + 1 for return address
    uint32 maxDepthForLevel = args + 1;
    if (maxDepthForLevel > m_maxArgOutDepth)
    {
        m_maxArgOutDepth = maxDepthForLevel;
    }

    return retInfo;
}